

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive2_test.cc
# Opt level: O0

void re2::LineEndsExhaustive(void)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ops;
  StringPiece *in_RCX;
  StringPiece *s;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  StringPiece local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  StringPiece local_40;
  StringPiece local_30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  
  StringPiece::StringPiece(&local_30," ");
  StringPiece::StringPiece(&local_40,"(?:^) (?:$) . a \\n (?:\\A) (?:\\z)");
  Split_abi_cxx11_(&local_20,(re2 *)&local_30,&local_40,in_RCX);
  ops = RegexpGenerator::EgrepOps_abi_cxx11_();
  StringPiece::StringPiece(&local_78,"ab\n");
  Explode_abi_cxx11_(&local_68,(re2 *)&local_78,s);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"",&local_c1);
  ExhaustiveTest(2,2,&local_20,ops,4,&local_68,(string *)local_98,(string *)local_c0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_20);
  return;
}

Assistant:

TEST(LineEnds, Exhaustive) {
  ExhaustiveTest(2, 2, Split(" ", "(?:^) (?:$) . a \\n (?:\\A) (?:\\z)"),
                 RegexpGenerator::EgrepOps(),
                 4, Explode("ab\n"), "", "");
}